

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::move
          (basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *this,
          basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *other)

{
  char *pcVar1;
  size_t __n;
  char *__src;
  size_t sVar2;
  
  (this->super_allocator_ref<std::allocator<char>_>).alloc_ =
       (other->super_allocator_ref<std::allocator<char>_>).alloc_;
  (other->super_allocator_ref<std::allocator<char>_>).alloc_ = (allocator<char> *)0x0;
  pcVar1 = (other->super_basic_buffer<char>).ptr_;
  __n = (other->super_basic_buffer<char>).size_;
  sVar2 = (other->super_basic_buffer<char>).capacity_;
  __src = other->store_;
  if (pcVar1 == __src) {
    (this->super_basic_buffer<char>).ptr_ = this->store_;
    (this->super_basic_buffer<char>).capacity_ = sVar2;
    if (__n != 0) {
      memmove(this->store_,__src,__n);
    }
  }
  else {
    (this->super_basic_buffer<char>).ptr_ = pcVar1;
    (this->super_basic_buffer<char>).capacity_ = sVar2;
    (other->super_basic_buffer<char>).ptr_ = __src;
    (other->super_basic_buffer<char>).capacity_ = 0;
    sVar2 = (this->super_basic_buffer<char>).capacity_;
  }
  if (sVar2 < __n) {
    (**(this->super_basic_buffer<char>)._vptr_basic_buffer)(this,__n);
  }
  (this->super_basic_buffer<char>).size_ = __n;
  return;
}

Assistant:

void move(basic_memory_buffer &other) {
    Allocator &this_alloc = *this, &other_alloc = other;
    this_alloc = std::move(other_alloc);
    T* data = other.data();
    std::size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      std::uninitialized_copy(other.store_, other.store_ + size,
                              internal::make_checked(store_, capacity));
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }